

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O2

Error __thiscall asmjit::v1_14::BaseAssembler::comment(BaseAssembler *this,char *data,size_t size)

{
  EmitterFlags EVar1;
  Logger *pLVar2;
  Error EVar3;
  
  EVar1 = (this->super_BaseEmitter)._emitterFlags;
  if ((EVar1 & kLogComments) == kNone) {
    if ((EVar1 & kAttached) == kNone) {
      EVar3 = BaseEmitter::reportError(&this->super_BaseEmitter,5,(char *)0x0);
      return EVar3;
    }
  }
  else {
    pLVar2 = (this->super_BaseEmitter)._logger;
    if (pLVar2 == (Logger *)0x0) {
      DebugUtils::assertionFailed
                ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/assembler.cpp"
                 ,0x177,"_logger != nullptr");
    }
    (*pLVar2->_vptr_Logger[2])();
    pLVar2 = (this->super_BaseEmitter)._logger;
    (*pLVar2->_vptr_Logger[2])(pLVar2,"\n",1);
  }
  return 0;
}

Assistant:

Error BaseAssembler::comment(const char* data, size_t size) {
  if (!hasEmitterFlag(EmitterFlags::kLogComments)) {
    if (!hasEmitterFlag(EmitterFlags::kAttached))
      return reportError(DebugUtils::errored(kErrorNotInitialized));
    return kErrorOk;
  }

#ifndef ASMJIT_NO_LOGGING
  // Logger cannot be NULL if `EmitterFlags::kLogComments` is set.
  ASMJIT_ASSERT(_logger != nullptr);

  _logger->log(data, size);
  _logger->log("\n", 1);
  return kErrorOk;
#else
  DebugUtils::unused(data, size);
  return kErrorOk;
#endif
}